

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

bool __thiscall
nlohmann::detail::
binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
::get_cbor_binary(binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
                  *this,binary_t *result)

{
  byte bVar1;
  byte *pbVar2;
  size_t byte_;
  json_sax_t *pjVar3;
  bool bVar4;
  int iVar5;
  binary_t chunk;
  string last_token;
  parse_error local_d8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  
  bVar4 = unexpect_eof(this,cbor,"binary");
  if (bVar4) {
    switch(this->current) {
    case 0x40:
    case 0x41:
    case 0x42:
    case 0x43:
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x47:
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x4b:
    case 0x4c:
    case 0x4d:
    case 0x4e:
    case 0x4f:
    case 0x50:
    case 0x51:
    case 0x52:
    case 0x53:
    case 0x54:
    case 0x55:
    case 0x56:
    case 0x57:
      bVar4 = get_binary<unsigned_int>(this,cbor,this->current & 0x1f,result);
      return bVar4;
    case 0x58:
      local_d8.super_exception._0_8_ = local_d8.super_exception._0_8_ & 0xffffffffffffff00;
      bVar4 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
              ::get_number<unsigned_char,false>
                        ((binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
                          *)this,cbor,(uchar *)&local_d8);
      if (bVar4) {
        bVar4 = get_binary<unsigned_char>
                          (this,cbor,(uchar)local_d8.super_exception.super_exception,result);
        return bVar4;
      }
      break;
    case 0x59:
      local_d8.super_exception._0_8_ = local_d8.super_exception._0_8_ & 0xffffffffffff0000;
      bVar4 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
              ::get_number<unsigned_short,false>
                        ((binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
                          *)this,cbor,(unsigned_short *)&local_d8);
      if (bVar4) {
        bVar4 = get_binary<unsigned_short>(this,cbor,local_d8.super_exception._0_2_,result);
        return bVar4;
      }
      break;
    case 0x5a:
      local_d8.super_exception._0_8_ = local_d8.super_exception._0_8_ & 0xffffffff00000000;
      bVar4 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
              ::get_number<unsigned_int,false>
                        ((binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
                          *)this,cbor,(uint *)&local_d8);
      if (bVar4) {
        bVar4 = get_binary<unsigned_int>(this,cbor,local_d8.super_exception._0_4_,result);
        return bVar4;
      }
      break;
    case 0x5b:
      local_d8.super_exception._0_8_ = (pointer)0x0;
      bVar4 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
              ::get_number<unsigned_long,false>
                        ((binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
                          *)this,cbor,(unsigned_long *)&local_d8);
      if (bVar4) {
        bVar4 = get_binary<unsigned_long>(this,cbor,local_d8.super_exception._0_8_,result);
        return bVar4;
      }
      break;
    default:
      get_token_string(&local_48,this);
      byte_ = this->chars_read;
      pjVar3 = this->sax;
      std::operator+(&local_88,
                     "expected length specification (0x40-0x5B) or indefinite binary array type (0x5F); last byte: 0x"
                     ,&local_48);
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"binary","");
      exception_message(&local_68,this,cbor,&local_88,&local_a8);
      parse_error::create(&local_d8,0x71,byte_,&local_68);
      iVar5 = (*(pjVar3->super_json_sax_t)._vptr_json_sax[0xc])(pjVar3,byte_,&local_48,&local_d8);
      local_d8.super_exception._0_8_ = &PTR__exception_00117d48;
      std::runtime_error::~runtime_error((runtime_error *)((long)&local_d8 + 0x10));
      std::exception::~exception((exception *)&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p == &local_48.field_2) {
        return (bool)(char)iVar5;
      }
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      return (bool)(char)iVar5;
    case 0x5f:
      do {
        this->chars_read = this->chars_read + 1;
        pbVar2 = (byte *)(this->ia).current._M_current;
        if (pbVar2 == (byte *)(this->ia).end._M_current) {
          this->current = -1;
        }
        else {
          bVar1 = *pbVar2;
          (this->ia).current._M_current = (char *)(pbVar2 + 1);
          this->current = (uint)bVar1;
          if (bVar1 == 0xff) {
            return (bool)1;
          }
        }
        local_d8.super_exception.m = (runtime_error)0x0;
        local_d8.super_exception._17_1_ = 0;
        local_d8.super_exception._18_6_ = 0;
        local_d8.super_exception._24_2_ = 0;
        local_d8.super_exception._0_8_ = (pointer)0x0;
        local_d8.super_exception.id._0_2_ = 0;
        local_d8.super_exception._10_6_ = 0;
        bVar4 = get_cbor_binary(this,(binary_t *)&local_d8);
        if (bVar4) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)result,
                     (result->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish,local_d8.super_exception._0_8_,
                     CONCAT62(local_d8.super_exception._10_6_,
                              (undefined2)local_d8.super_exception.id));
        }
        if ((pointer)local_d8.super_exception._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_d8.super_exception._0_8_,
                          CONCAT62(local_d8.super_exception._18_6_,local_d8.super_exception._16_2_)
                          - local_d8.super_exception._0_8_);
        }
      } while (bVar4);
    }
  }
  return false;
}

Assistant:

bool get_cbor_binary(binary_t& result)
    {
        if (JSON_HEDLEY_UNLIKELY(!unexpect_eof(input_format_t::cbor, "binary")))
        {
            return false;
        }

        switch (current)
        {
            // Binary data (0x00..0x17 bytes follow)
            case 0x40:
            case 0x41:
            case 0x42:
            case 0x43:
            case 0x44:
            case 0x45:
            case 0x46:
            case 0x47:
            case 0x48:
            case 0x49:
            case 0x4A:
            case 0x4B:
            case 0x4C:
            case 0x4D:
            case 0x4E:
            case 0x4F:
            case 0x50:
            case 0x51:
            case 0x52:
            case 0x53:
            case 0x54:
            case 0x55:
            case 0x56:
            case 0x57:
            {
                return get_binary(input_format_t::cbor, static_cast<unsigned int>(current) & 0x1Fu, result);
            }

            case 0x58: // Binary data (one-byte uint8_t for n follows)
            {
                std::uint8_t len{};
                return get_number(input_format_t::cbor, len) &&
                       get_binary(input_format_t::cbor, len, result);
            }

            case 0x59: // Binary data (two-byte uint16_t for n follow)
            {
                std::uint16_t len{};
                return get_number(input_format_t::cbor, len) &&
                       get_binary(input_format_t::cbor, len, result);
            }

            case 0x5A: // Binary data (four-byte uint32_t for n follow)
            {
                std::uint32_t len{};
                return get_number(input_format_t::cbor, len) &&
                       get_binary(input_format_t::cbor, len, result);
            }

            case 0x5B: // Binary data (eight-byte uint64_t for n follow)
            {
                std::uint64_t len{};
                return get_number(input_format_t::cbor, len) &&
                       get_binary(input_format_t::cbor, len, result);
            }

            case 0x5F: // Binary data (indefinite length)
            {
                while (get() != 0xFF)
                {
                    binary_t chunk;
                    if (!get_cbor_binary(chunk))
                    {
                        return false;
                    }
                    result.insert(result.end(), chunk.begin(), chunk.end());
                }
                return true;
            }

            default:
            {
                auto last_token = get_token_string();
                return sax->parse_error(chars_read, last_token, parse_error::create(113, chars_read, exception_message(input_format_t::cbor, "expected length specification (0x40-0x5B) or indefinite binary array type (0x5F); last byte: 0x" + last_token, "binary")));
            }
        }
    }